

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dgPolyhedra.cpp
# Opt level: O2

bool __thiscall dgPolyhedra::GetConectedSurface(dgPolyhedra *this,dgPolyhedra *polyhedra)

{
  int iVar1;
  dgEdge *pdVar2;
  HaI32 HVar3;
  dgEdge **ppdVar4;
  long lVar5;
  dgEdge *pdVar6;
  int iVar7;
  dgEdge *pdVar8;
  bool bVar9;
  dgStack<dgEdge_*> stackPool;
  Iterator local_c048;
  HaI32 faceIndex [4096];
  HaI64 faceDataIndex [4096];
  
  if ((this->super_dgTree<dgEdge,_long>).m_count == 0) {
    bVar9 = false;
  }
  else {
    local_c048.m_tree = &this->super_dgTree<dgEdge,_long>;
    local_c048.m_ptr =
         &dgTree<dgEdge,_long>::Minimum(&this->super_dgTree<dgEdge,_long>)->super_dgRedBackNode;
    while (bVar9 = (dgTreeNode *)local_c048.m_ptr != (dgTreeNode *)0x0, bVar9) {
      if ((((dgEdge *)((long)local_c048.m_ptr + 0x28))->m_mark < this->m_baseMark) &&
         (0 < ((dgEdge *)((long)local_c048.m_ptr + 0x28))->m_incidentFace)) {
        pdVar8 = (dgEdge *)((long)local_c048.m_ptr + 0x28);
        dgStack<dgEdge_*>::dgStack(&stackPool,(this->super_dgTree<dgEdge,_long>).m_count);
        ppdVar4 = dgStack<dgEdge_*>::operator[](&stackPool,0);
        HVar3 = IncLRU(this);
        *ppdVar4 = pdVar8;
        iVar7 = 1;
        do {
          do {
            if (iVar7 == 0) {
              EndFace(polyhedra);
              free(stackPool.super_dgStackBase.m_ptr);
              return bVar9;
            }
            lVar5 = (long)iVar7;
            iVar7 = iVar7 + -1;
            pdVar8 = ppdVar4[lVar5 + -1];
          } while (pdVar8->m_mark == HVar3);
          iVar1 = (this->super_dgTree<dgEdge,_long>).m_count;
          lVar5 = 0;
          pdVar6 = pdVar8;
          do {
            pdVar6->m_mark = HVar3;
            faceIndex[lVar5] = pdVar6->m_incidentVertex;
            faceDataIndex[lVar5] = pdVar6->m_userData;
            if (lVar5 == 0xfff) {
              __assert_fail("count < hacd::HaI32 ((sizeof (faceIndex)/sizeof(faceIndex[0])))",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono_thirdparty/HACDv2/dgPolyhedra.cpp"
                            ,0x8cb,"bool dgPolyhedra::GetConectedSurface(dgPolyhedra &) const");
            }
            pdVar2 = pdVar6->m_twin;
            if ((0 < pdVar2->m_incidentFace) && (pdVar2->m_mark != HVar3)) {
              ppdVar4[iVar7] = pdVar2;
              iVar7 = iVar7 + 1;
              if (iVar1 <= iVar7) {
                __assert_fail("index < GetCount()",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono_thirdparty/HACDv2/dgPolyhedra.cpp"
                              ,0x8d0,"bool dgPolyhedra::GetConectedSurface(dgPolyhedra &) const");
              }
            }
            pdVar6 = pdVar6->m_next;
            lVar5 = lVar5 + 1;
          } while (pdVar6 != pdVar8);
          AddFace(polyhedra,(HaI32)lVar5,faceIndex,faceDataIndex);
        } while( true );
      }
      dgTree<dgEdge,_long>::Iterator::operator++(&local_c048,0);
    }
  }
  return bVar9;
}

Assistant:

bool dgPolyhedra::GetConectedSurface (dgPolyhedra &polyhedra) const
{
	if (!GetCount()) {
		return false;
	}

	dgEdge* edge = NULL;
	Iterator iter(*this);
	for (iter.Begin (); iter; iter ++) {
		edge = &(*iter);
		if ((edge->m_mark < m_baseMark) && (edge->m_incidentFace > 0)) {
			break;
		}
	}

	if (!iter) {
		return false;
	}

	hacd::HaI32 faceIndex[4096];
	hacd::HaI64 faceDataIndex[4096];
	dgStack<dgEdge*> stackPool (GetCount()); 
	dgEdge** const stack = &stackPool[0];

	hacd::HaI32 mark = IncLRU();

	polyhedra.BeginFace ();
	stack[0] = edge;
	hacd::HaI32 index = 1;
	while (index) {
		index --;
		dgEdge* const edge = stack[index];

		if (edge->m_mark == mark) {
			continue;
		}

		hacd::HaI32 count = 0;
		dgEdge* ptr = edge;
		do {
			ptr->m_mark = mark;
			faceIndex[count] = ptr->m_incidentVertex;
			faceDataIndex[count] = hacd::HaI64 (ptr->m_userData);
			count ++;
			HACD_ASSERT (count <  hacd::HaI32 ((sizeof (faceIndex)/sizeof(faceIndex[0]))));

			if ((ptr->m_twin->m_incidentFace > 0) && (ptr->m_twin->m_mark != mark)) {
				stack[index] = ptr->m_twin;
				index ++;
				HACD_ASSERT (index < GetCount());
			}

			ptr = ptr->m_next;
		} while (ptr != edge);

		polyhedra.AddFace (count, &faceIndex[0], &faceDataIndex[0]);
	}

	polyhedra.EndFace ();

	return true;
}